

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

size_t Jupiter::Timer::check(void)

{
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  const_iterator local_30;
  _List_iterator<Jupiter::Timer_*> local_28;
  iterator dead_node;
  _Self local_18;
  iterator node;
  size_t result;
  
  node._M_node = (_List_node_base *)0x0;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::begin
                 (&o_timers_abi_cxx11_);
  while( true ) {
    dead_node = std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::end
                          (&o_timers_abi_cxx11_);
    bVar1 = std::operator==(&local_18,&dead_node);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppTVar3 = std::_List_iterator<Jupiter::Timer_*>::operator*(&local_18);
    iVar2 = (**((*ppTVar3)->super_Thinker)._vptr_Thinker)();
    if (iVar2 == 0) {
      std::_List_iterator<Jupiter::Timer_*>::operator++(&local_18);
    }
    else {
      local_28._M_node = local_18._M_node;
      std::_List_iterator<Jupiter::Timer_*>::operator++(&local_18);
      ppTVar3 = std::_List_iterator<Jupiter::Timer_*>::operator*(&local_28);
      if (*ppTVar3 != (Timer *)0x0) {
        (*((*ppTVar3)->super_Thinker)._vptr_Thinker[2])();
      }
      std::_List_const_iterator<Jupiter::Timer_*>::_List_const_iterator(&local_30,&local_28);
      std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::erase
                (&o_timers_abi_cxx11_,local_30);
      node._M_node = (_List_node_base *)((long)&(node._M_node)->_M_next + 1);
    }
  }
  return (size_t)node._M_node;
}

Assistant:

size_t Jupiter::Timer::check()
{
	size_t result = 0;
	auto node = o_timers.begin();

	while (node != o_timers.end())
	{
		if ((*node)->think() != 0)
		{
			auto dead_node = node;
			++node;

			delete *dead_node;
			o_timers.erase(dead_node);

			++result;
		}
		else
			++node;
	}

	return result;
}